

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O2

bool anon_unknown.dwarf_9ddf8c::NotInProjectDir::IsInDirectory(string *baseDir,string *testDir)

{
  long lVar1;
  bool bVar2;
  
  bVar2 = false;
  lVar1 = std::__cxx11::string::find((string *)testDir,(ulong)baseDir);
  if (lVar1 == 0) {
    bVar2 = true;
    if (testDir->_M_string_length != baseDir->_M_string_length) {
      bVar2 = (testDir->_M_dataplus)._M_p[baseDir->_M_string_length] == '/';
    }
  }
  return bVar2;
}

Assistant:

static bool IsInDirectory(const std::string& baseDir,
                            const std::string& testDir)
  {
    // First check if the test directory "starts with" the base directory:
    if (testDir.find(baseDir) != 0) {
      return false;
    }
    // If it does, then check that it's either the same string, or that the
    // next character is a slash:
    return ((testDir.size() == baseDir.size()) ||
            (testDir[baseDir.size()] == '/'));
  }